

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_metadata.cpp
# Opt level: O3

void handlegraph::PathMetadata::parse_path_name
               (string *path_name,PathSense *sense,string *sample,string *locus,size_t *haplotype,
               size_t *phase_block,subrange_t *subrange)

{
  char cVar1;
  int iVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __s;
  char *pcVar3;
  bool bVar4;
  int *piVar5;
  size_t sVar6;
  unsigned_long uVar7;
  pointer psVar8;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  PathSense PVar12;
  smatch result;
  char *local_78;
  undefined8 local_70;
  char local_68;
  undefined7 uStack_67;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  char *local_38;
  
  local_48 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  __s._M_current = (path_name->_M_dataplus)._M_p;
  bVar4 = std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                    (__s,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(__s._M_current + path_name->_M_string_length),
                     (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)local_58,
                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)FORMAT_abi_cxx11_,0);
  if (!bVar4) {
    *sense = GENERIC;
    std::__cxx11::string::_M_assign((string *)sample);
    std::__cxx11::string::_M_assign((string *)locus);
    *haplotype = 0xffffffffffffffff;
    *phase_block = 0xffffffffffffffff;
    goto LAB_0013d6a2;
  }
  lVar10 = local_58._8_8_ - local_58._0_8_;
  if (lVar10 == 0) {
    PVar12 = HAPLOTYPE;
    if (((pointer)(local_58._0_8_ + -0x48))->matched == false) {
LAB_0013d013:
      psVar8 = (pointer)(local_58._0_8_ + lVar10 + -0x48);
LAB_0013d01b:
      PVar12 = (PathSense)psVar8->matched;
    }
  }
  else {
    lVar11 = (lVar10 >> 3) * -0x5555555555555555;
    if (lVar11 - 8U < 0xfffffffffffffffb) {
      cVar1 = ((pointer)(local_58._0_8_ + 0x60))->matched;
    }
    else {
      cVar1 = *(char *)(local_58._0_8_ + lVar10 + -0x38);
    }
    PVar12 = HAPLOTYPE;
    if (cVar1 == '\0') {
      if (lVar11 - 7U < 0xfffffffffffffffc) {
        cVar1 = ((pointer)(local_58._0_8_ + 0x48))->matched;
      }
      else {
        cVar1 = *(char *)(local_58._0_8_ + lVar10 + -0x38);
      }
      PVar12 = REFERENCE;
      if (cVar1 == '\0') {
        if (0xfffffffffffffffc < lVar11 - 6U) goto LAB_0013d013;
        psVar8 = (pointer)(local_58._0_8_ + 0x30);
        goto LAB_0013d01b;
      }
    }
  }
  *sense = PVar12;
  if (local_58._0_8_ == local_58._8_8_) {
    if (*(char *)(local_58._0_8_ + lVar10 + -0x38) == '\0') {
LAB_0013d09c:
      std::__cxx11::string::_M_assign((string *)sample);
      lVar10 = local_58._8_8_ - local_58._0_8_;
      if ((lVar10 == 0) || (0xfffffffffffffffd < (lVar10 >> 3) * -0x5555555555555555 - 5U)) {
        psVar8 = (pointer)(local_58._0_8_ + lVar10 + -0x48);
      }
      else {
        psVar8 = (pointer)(local_58._0_8_ + 0x18);
      }
      if (psVar8->matched == true) {
        local_78 = &local_68;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_78,
                   (psVar8->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,
                   (psVar8->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).second._M_current);
      }
      else {
        local_78 = &local_68;
        local_70 = 0;
        local_68 = '\0';
      }
      std::__cxx11::string::operator=((string *)locus,(string *)&local_78);
      if (local_78 != &local_68) goto LAB_0013d354;
      goto LAB_0013d361;
    }
LAB_0013d161:
    psVar8 = (pointer)(local_58._0_8_ + lVar10 + -0x48);
LAB_0013d168:
    if (psVar8->matched == true) {
      local_78 = &local_68;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_78,
                 (psVar8->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current,
                 (psVar8->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
    }
    else {
      local_78 = &local_68;
      local_70 = 0;
      local_68 = '\0';
    }
    std::__cxx11::string::operator=((string *)sample,(string *)&local_78);
    if (local_78 != &local_68) {
      operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
    }
    lVar10 = local_58._8_8_ - local_58._0_8_;
    if ((lVar10 == 0) || (0xfffffffffffffffb < (lVar10 >> 3) * -0x5555555555555555 - 7U)) {
      psVar8 = (pointer)(local_58._0_8_ + lVar10 + -0x48);
    }
    else {
      psVar8 = (pointer)(local_58._0_8_ + 0x48);
    }
    if (psVar8->matched == true) {
      local_78 = &local_68;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_78,
                 (psVar8->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current,
                 (psVar8->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
    }
    else {
      local_70 = 0;
      local_68 = '\0';
      local_78 = &local_68;
    }
    std::__cxx11::string::operator=((string *)locus,(string *)&local_78);
    if (local_78 != &local_68) {
      operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
    }
    lVar10 = local_58._8_8_ - local_58._0_8_;
    if ((lVar10 == 0) || (0xfffffffffffffffc < (lVar10 >> 3) * -0x5555555555555555 - 6U)) {
      psVar8 = (pointer)(local_58._0_8_ + lVar10 + -0x48);
    }
    else {
      psVar8 = (pointer)(local_58._0_8_ + 0x30);
    }
    if (psVar8->matched == true) {
      local_78 = &local_68;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&local_78,
                 (psVar8->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current,
                 (psVar8->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).second._M_current);
    }
    else {
      local_70 = 0;
      local_68 = '\0';
      local_78 = &local_68;
    }
    pcVar3 = local_78;
    piVar5 = __errno_location();
    iVar2 = *piVar5;
    *piVar5 = 0;
    sVar6 = strtoll(pcVar3,&local_38,10);
    if (local_38 != pcVar3) {
      if (*piVar5 == 0) {
LAB_0013d2fa:
        *piVar5 = iVar2;
      }
      else if (*piVar5 == 0x22) {
        sVar6 = std::__throw_out_of_range("stoll");
        goto LAB_0013d2fa;
      }
      *haplotype = sVar6;
      if (local_78 != &local_68) {
        operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
      }
      goto LAB_0013d53f;
    }
  }
  else {
    lVar11 = (lVar10 >> 3) * -0x5555555555555555;
    if (lVar11 - 7U < 0xfffffffffffffffc) {
      if (((pointer)(local_58._0_8_ + 0x48))->matched != true) goto LAB_0013d070;
LAB_0013d058:
      if (lVar11 - 6U < 0xfffffffffffffffd) {
        if (((pointer)(local_58._0_8_ + 0x30))->matched != true) goto LAB_0013d070;
LAB_0013d10a:
        if (0xfffffffffffffffd < lVar11 - 5U) goto LAB_0013d161;
        psVar8 = (pointer)(local_58._0_8_ + 0x18);
        goto LAB_0013d168;
      }
      if (*(char *)(local_58._0_8_ + lVar10 + -0x38) == '\x01') goto LAB_0013d10a;
LAB_0013d11a:
      cVar1 = *(char *)(local_58._0_8_ + lVar10 + -0x38);
    }
    else {
      if (*(char *)(local_58._0_8_ + lVar10 + -0x38) != '\0') goto LAB_0013d058;
LAB_0013d070:
      if (0xfffffffffffffffc < lVar11 - 6U) goto LAB_0013d11a;
      cVar1 = ((pointer)(local_58._0_8_ + 0x30))->matched;
    }
    if (cVar1 == '\x01') {
      psVar8 = (pointer)(local_58._0_8_ + lVar10 + -0x48);
      if (lVar11 - 5U < 0xfffffffffffffffe) {
        psVar8 = (pointer)(local_58._0_8_ + 0x18);
      }
      if (psVar8->matched == true) {
        local_78 = &local_68;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_78,
                   (psVar8->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,
                   (psVar8->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).second._M_current);
      }
      else {
        local_78 = &local_68;
        local_70 = 0;
        local_68 = '\0';
      }
      std::__cxx11::string::operator=((string *)sample,(string *)&local_78);
      if (local_78 != &local_68) {
        operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
      }
      lVar10 = local_58._8_8_ - local_58._0_8_;
      if ((lVar10 == 0) || (0xfffffffffffffffc < (lVar10 >> 3) * -0x5555555555555555 - 6U)) {
        psVar8 = (pointer)(local_58._0_8_ + lVar10 + -0x48);
      }
      else {
        psVar8 = (pointer)(local_58._0_8_ + 0x30);
      }
      local_78 = &local_68;
      if (psVar8->matched == true) {
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_78,
                   (psVar8->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,
                   (psVar8->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).second._M_current);
      }
      else {
        local_70 = 0;
        local_68 = '\0';
      }
      std::__cxx11::string::operator=((string *)locus,(string *)&local_78);
      if (local_78 != &local_68) {
LAB_0013d354:
        operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
      }
LAB_0013d361:
      *haplotype = 0xffffffffffffffff;
    }
    else {
      if (lVar11 - 7U < 0xfffffffffffffffc) {
        cVar1 = ((pointer)(local_58._0_8_ + 0x48))->matched;
      }
      else {
        cVar1 = *(char *)(local_58._0_8_ + lVar10 + -0x38);
      }
      if (cVar1 != '\x01') goto LAB_0013d09c;
      psVar8 = (pointer)(local_58._0_8_ + lVar10 + -0x48);
      if (lVar11 - 5U < 0xfffffffffffffffe) {
        psVar8 = (pointer)(local_58._0_8_ + 0x18);
      }
      local_78 = &local_68;
      if (psVar8->matched == true) {
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_78,
                   (psVar8->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,
                   (psVar8->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).second._M_current);
      }
      else {
        local_70 = 0;
        local_68 = '\0';
      }
      std::__cxx11::string::operator=((string *)sample,(string *)&local_78);
      if (local_78 != &local_68) {
        operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
      }
      lVar10 = local_58._8_8_ - local_58._0_8_;
      if ((lVar10 == 0) || (0xfffffffffffffffb < (lVar10 >> 3) * -0x5555555555555555 - 7U)) {
        psVar8 = (pointer)(local_58._0_8_ + lVar10 + -0x48);
      }
      else {
        psVar8 = (pointer)(local_58._0_8_ + 0x48);
      }
      if (psVar8->matched == true) {
        local_78 = &local_68;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_78,
                   (psVar8->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,
                   (psVar8->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).second._M_current);
      }
      else {
        local_70 = 0;
        local_68 = '\0';
        local_78 = &local_68;
      }
      std::__cxx11::string::operator=((string *)locus,(string *)&local_78);
      if (local_78 != &local_68) {
        operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
      }
      *haplotype = 0xffffffffffffffff;
    }
LAB_0013d53f:
    lVar10 = local_58._8_8_ - local_58._0_8_;
    if ((lVar10 == 0) || (0xfffffffffffffffa < (lVar10 >> 3) * -0x5555555555555555 - 8U)) {
      if (*(char *)(local_58._0_8_ + lVar10 + -0x38) == '\0') goto LAB_0013d5a4;
      psVar8 = (pointer)(local_58._0_8_ + lVar10 + -0x48);
LAB_0013d580:
      if (psVar8->matched == true) {
        local_78 = &local_68;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_78,
                   (psVar8->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,
                   (psVar8->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).second._M_current);
      }
      else {
        local_78 = &local_68;
        local_70 = 0;
        local_68 = '\0';
      }
      pcVar3 = local_78;
      piVar5 = __errno_location();
      iVar2 = *piVar5;
      *piVar5 = 0;
      sVar6 = strtoll(pcVar3,&local_38,10);
      if (local_38 != pcVar3) {
        if (*piVar5 == 0) {
LAB_0013d60c:
          *piVar5 = iVar2;
        }
        else if (*piVar5 == 0x22) {
          sVar6 = std::__throw_out_of_range("stoll");
          goto LAB_0013d60c;
        }
        *phase_block = sVar6;
        if (local_78 != &local_68) {
          operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
        }
        lVar10 = local_58._8_8_ - local_58._0_8_;
        goto LAB_0013d647;
      }
      std::__throw_invalid_argument("stoll");
    }
    else {
      if (((pointer)(local_58._0_8_ + 0x60))->matched != false) {
        psVar8 = (pointer)(local_58._0_8_ + 0x60);
        goto LAB_0013d580;
      }
LAB_0013d5a4:
      *phase_block = 0xffffffffffffffff;
LAB_0013d647:
      if ((local_58._0_8_ == local_58._8_8_) ||
         (0xfffffffffffffff9 < (lVar10 >> 3) * -0x5555555555555555 - 9U)) {
        if (*(char *)(local_58._0_8_ + lVar10 + -0x38) == '\0') goto LAB_0013d6a2;
        psVar8 = (pointer)((long)&(((pointer)(local_58._0_8_ + -0x48))->
                                  super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ).first._M_current + lVar10);
      }
      else {
        if (((pointer)(local_58._0_8_ + 0x78))->matched == false) {
LAB_0013d6a2:
          *(undefined4 *)&subrange->first = 0xffffffff;
          *(undefined4 *)((long)&subrange->first + 4) = 0xffffffff;
          *(undefined4 *)&subrange->second = 0xffffffff;
          *(undefined4 *)((long)&subrange->second + 4) = 0xffffffff;
          goto LAB_0013d6b2;
        }
        psVar8 = (pointer)(local_58._0_8_ + 0x78);
      }
      if (psVar8->matched == true) {
        local_78 = &local_68;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_78,
                   (psVar8->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).first._M_current,
                   (psVar8->
                   super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).second._M_current);
      }
      else {
        local_78 = &local_68;
        local_70 = 0;
        local_68 = '\0';
      }
      pcVar3 = local_78;
      piVar5 = __errno_location();
      iVar2 = *piVar5;
      *piVar5 = 0;
      uVar7 = strtoll(pcVar3,&local_38,10);
      if (local_38 != pcVar3) {
        if (*piVar5 == 0) {
LAB_0013d732:
          *piVar5 = iVar2;
        }
        else if (*piVar5 == 0x22) {
          uVar7 = std::__throw_out_of_range("stoll");
          goto LAB_0013d732;
        }
        subrange->first = uVar7;
        if (local_78 != &local_68) {
          operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
        }
        lVar10 = local_58._8_8_ - local_58._0_8_;
        if ((lVar10 == 0) || (0xfffffffffffffff8 < (lVar10 >> 3) * -0x5555555555555555 - 10U)) {
          if (*(char *)(local_58._0_8_ + lVar10 + -0x38) == '\0') goto LAB_0013d7cb;
          psVar8 = (pointer)(local_58._0_8_ + lVar10 + -0x48);
        }
        else {
          if (((pointer)(local_58._0_8_ + 0x90))->matched == false) {
LAB_0013d7cb:
            subrange->second = 0xffffffffffffffff;
            goto LAB_0013d6b2;
          }
          psVar8 = (pointer)(local_58._0_8_ + 0x90);
        }
        if (psVar8->matched == true) {
          local_78 = &local_68;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)&local_78,
                     (psVar8->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).first._M_current,
                     (psVar8->
                     super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).second._M_current);
        }
        else {
          local_70 = 0;
          local_68 = '\0';
          local_78 = &local_68;
        }
        pcVar3 = local_78;
        iVar2 = *piVar5;
        *piVar5 = 0;
        uVar7 = strtoll(local_78,&local_38,10);
        if (local_38 == pcVar3) goto LAB_0013d881;
        if (*piVar5 == 0) {
LAB_0013d82b:
          *piVar5 = iVar2;
        }
        else if (*piVar5 == 0x22) {
          uVar7 = std::__throw_out_of_range("stoll");
          goto LAB_0013d82b;
        }
        subrange->second = uVar7;
        if (local_78 != &local_68) {
          operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
        }
LAB_0013d6b2:
        if ((pointer)local_58._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_58._0_8_,local_48._0_8_ - local_58._0_8_);
        }
        return;
      }
    }
    std::__throw_invalid_argument("stoll");
  }
  std::__throw_invalid_argument("stoll");
LAB_0013d881:
  uVar9 = std::__throw_invalid_argument("stoll");
  if ((pointer)local_58._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_58._0_8_,local_48._0_8_ - local_58._0_8_);
  }
  _Unwind_Resume(uVar9);
}

Assistant:

void PathMetadata::parse_path_name(const std::string& path_name,
                                   PathSense& sense,
                                   std::string& sample,
                                   std::string& locus,
                                   size_t& haplotype,
                                   size_t& phase_block,
                                   subrange_t& subrange) {

    std::smatch result;
    auto matched = std::regex_match(path_name, result, FORMAT);
    
    // Parse out each piece.
    // TODO: can we unify this with the other places we parse out from the
    // regex? With yet a third set of functions?
    if (matched) {
        if (result[PHASE_BLOCK_MATCH].matched) {
            // It's a haplotype because it has a phase block.
            sense = PathSense::HAPLOTYPE;
        } else if (result[LOCUS_MATCH_ANY].matched || result[LOCUS_MATCH_NUMERICAL_WITHOUT_HAPLOTYPE].matched) {
            // It's a reference because it has a locus and a sample
            sense = PathSense::REFERENCE;
        } else {
            // It's just a one-piece generic name
            sense = PathSense::GENERIC;
        }
        
        if (result[LOCUS_MATCH_ANY].matched && result[HAPLOTYPE_MATCH].matched) {
            // There's a haplotype and a locus and a sample
            sample = result[ASSEMBLY_OR_NAME_MATCH].str();
            locus = result[LOCUS_MATCH_ANY].str();
            haplotype = std::stoll(result[HAPLOTYPE_MATCH].str());
        } else if (result[LOCUS_MATCH_NUMERICAL_WITHOUT_HAPLOTYPE].matched) {
            // There's a numerical locus but no haplotype, and a sample
            sample = result[ASSEMBLY_OR_NAME_MATCH].str();
            locus = result[LOCUS_MATCH_NUMERICAL_WITHOUT_HAPLOTYPE].str();
            haplotype = NO_HAPLOTYPE;
        } else if (result[LOCUS_MATCH_ANY].matched) {
            // There's a non-numerical locus but no haplotype, and a sample
            sample = result[ASSEMBLY_OR_NAME_MATCH].str();
            locus = result[LOCUS_MATCH_ANY].str();
            haplotype = NO_HAPLOTYPE;
        } else {
            // There's nothing but the locus and maybe a range.
            sample = NO_SAMPLE_NAME;
            locus = result[ASSEMBLY_OR_NAME_MATCH].str();
            haplotype = NO_HAPLOTYPE;
        }
        
        if (result[PHASE_BLOCK_MATCH].matched) {
            // There's a phase block.
            // We know it is a number.
            phase_block = std::stoll(result[PHASE_BLOCK_MATCH].str());
        } else {
            // No phase block is stored
            phase_block = NO_PHASE_BLOCK;
        }
        
        if (result[RANGE_START_MATCH].matched) {
            // There is a range start, so pasre it
            subrange.first = std::stoll(result[RANGE_START_MATCH].str());
            if (result[RANGE_END_MATCH].matched) {
                // There is also an end, so parse that too
                subrange.second = std::stoll(result[RANGE_END_MATCH].str());
            } else {
                subrange.second = NO_END_POSITION;
            }
        } else {
            subrange = NO_SUBRANGE;
        }
    } else {
        // Just a generic path where the locus is all of it.
        sense = PathSense::GENERIC;
        sample = NO_SAMPLE_NAME;
        locus = path_name;
        haplotype = NO_HAPLOTYPE;
        phase_block = NO_PHASE_BLOCK;
        subrange = NO_SUBRANGE;
    }
}